

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

void __thiscall phyr::AccelBVH::constructBVH(AccelBVH *this)

{
  size_type sVar1;
  BVHTreeNode *treeNode;
  element_type *peVar2;
  reference __dest;
  BVHTreeNode *__x;
  LinearBVHNode *pLVar3;
  long in_RDI;
  int i_1;
  int linearIdx;
  BVHTreeNode *root;
  vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
  orderedObjectList;
  MemoryPool pool;
  int nodeCount;
  size_t i;
  vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> objectInfoList;
  size_t sz;
  int *in_stack_000003a0;
  int in_stack_000003a8;
  int in_stack_000003ac;
  vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *in_stack_000003b0;
  MemoryPool *in_stack_000003b8;
  AccelBVH *in_stack_000003c0;
  vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
  *in_stack_000003d8;
  size_t in_stack_fffffffffffffd80;
  MemoryPool *in_stack_fffffffffffffd88;
  BVHTreeNode *in_stack_fffffffffffffd98;
  AccelBVH *this_00;
  LinearBVHNode *in_stack_fffffffffffffdb8;
  size_t in_stack_fffffffffffffdc0;
  BVHObjectInfo *in_stack_fffffffffffffdc8;
  int local_228;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  MemoryPool *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  string local_1f8 [220];
  int local_11c;
  undefined1 local_118 [48];
  undefined1 local_e8 [80];
  BVHTreeNode *local_98;
  undefined1 local_79 [25];
  BVHTreeNode *local_60;
  
  sVar1 = std::
          vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
          size((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                *)(in_RDI + 0x10));
  if (sVar1 != 0) {
    treeNode = (BVHTreeNode *)
               std::
               vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
               ::size((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                       *)(in_RDI + 0x10));
    this_00 = (AccelBVH *)local_79;
    local_60 = treeNode;
    std::allocator<phyr::BVHObjectInfo>::allocator((allocator<phyr::BVHObjectInfo> *)0x1992dd);
    std::vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::vector
              ((vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *)this_00,
               (size_type)treeNode,(allocator_type *)in_stack_fffffffffffffd98);
    std::allocator<phyr::BVHObjectInfo>::~allocator((allocator<phyr::BVHObjectInfo> *)0x199303);
    for (local_98 = (BVHTreeNode *)0x0; local_98 < local_60;
        local_98 = (BVHTreeNode *)((long)&(local_98->bounds).pMin.x + 1)) {
      in_stack_fffffffffffffd98 = local_98;
      std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
      operator[]((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
                  *)(in_RDI + 0x10),(size_type)local_98);
      peVar2 = std::__shared_ptr_access<phyr::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<phyr::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x199348);
      (*peVar2->_vptr_Object[2])(local_118);
      BVHObjectInfo::BVHObjectInfo
                (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                 &in_stack_fffffffffffffdb8->bounds);
      __dest = std::vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::operator[]
                         ((vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *)
                          (local_79 + 1),(size_type)local_98);
      memcpy(__dest,local_e8,0x50);
    }
    local_11c = 0;
    MemoryPool::MemoryPool(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
    vector((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_> *
           )0x199428);
    formatString<char_const*,int>
              (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4
              );
    std::operator<<((ostream *)&std::cout,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    __x = constructBVHRecursive
                    (in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,in_stack_000003ac,
                     in_stack_000003a8,in_stack_000003a0,in_stack_000003d8);
    std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
    swap((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_> *)
         in_stack_fffffffffffffd98,
         (vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_> *)
         __x);
    formatString<char_const*,int,int>
              (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4
               ,in_stack_fffffffffffffde0);
    std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffde0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde0);
    pLVar3 = allocAligned<phyr::LinearBVHNode>(0x19952a);
    *(LinearBVHNode **)(in_RDI + 0x28) = pLVar3;
    for (local_228 = 0; local_228 < local_11c; local_228 = local_228 + 1) {
      LinearBVHNode::LinearBVHNode(in_stack_fffffffffffffdb8);
    }
    formatString<char_const*,int>
              (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4
              );
    std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    flattenBVH(this_00,treeNode,(int *)in_stack_fffffffffffffd98);
    std::vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>::
    ~vector((vector<std::shared_ptr<phyr::Object>,_std::allocator<std::shared_ptr<phyr::Object>_>_>
             *)in_stack_fffffffffffffd98);
    MemoryPool::~MemoryPool(in_stack_fffffffffffffde8);
    std::vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_>::~vector
              ((vector<phyr::BVHObjectInfo,_std::allocator<phyr::BVHObjectInfo>_> *)
               in_stack_fffffffffffffd98);
  }
  return;
}

Assistant:

void AccelBVH::constructBVH() {
    if (objectList.size() == 0) return;

    // Initiate object info list
    size_t sz = objectList.size();
    std::vector<BVHObjectInfo> objectInfoList(sz);

    for (size_t i = 0; i < sz; i++)
        objectInfoList[i] = { i, objectList[i]->worldBounds() };

    // Create a BVH Tree from the object info list
    int nodeCount = 0;
    // Memory pool with a block size of 1MB
    MemoryPool pool(1024 * 1024);
    // Stores the ordered permutation of objectList as defined
    // by the recursive BVH algorithm
    std::vector<std::shared_ptr<Object>> orderedObjectList;

    // Recursively build the BVH Tree
    LOG_INFO("Computing BVH tree...");
    BVHTreeNode* root = constructBVHRecursive(pool, objectInfoList, 0, sz,
                                              &nodeCount, orderedObjectList);
    objectList.swap(orderedObjectList);
    LOG_INFO_FMT("Computed BVH nodes: %d", nodeCount);

    // Compute linear BVH by DFS on {root}
    int linearIdx = 0;
    bvhNodes = allocAligned<LinearBVHNode>(nodeCount);
    // Initilize components in {LinearBVHNode}
    for (int i = 0; i < nodeCount; i++)
        new (&bvhNodes[i]) LinearBVHNode();

    // Transform BVH tree to a BVH linear array
    LOG_INFO("Flattening BVH nodes...");
    flattenBVH(root, &linearIdx);
    ASSERT(linearIdx == nodeCount);
}